

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall httplib::Server::read_content(Server *this,Stream *strm,Request *req,Response *res)

{
  bool bVar1;
  long lVar2;
  iterator cur;
  undefined8 local_a8;
  string local_a0;
  _Any_data local_80;
  code *local_70;
  code *local_68;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  local_80._M_unused._M_object = &local_a8;
  local_a8 = 0;
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h:5171:11)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h:5171:11)>
             ::_M_manager;
  local_48 = std::
             _Function_handler<bool_(const_httplib::MultipartFormData_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h:5177:11)>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<bool_(const_httplib::MultipartFormData_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h:5177:11)>
             ::_M_manager;
  local_80._8_8_ = 0;
  local_68 = std::
             _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h:5181:11)>
             ::_M_invoke;
  local_70 = std::
             _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h:5181:11)>
             ::_M_manager;
  local_60._M_unused._M_object = local_80._M_unused._M_object;
  local_60._8_8_ = req;
  local_40._M_unused._M_object = req;
  bVar1 = read_content_core(this,strm,req,res,(ContentReceiver *)&local_40,
                            (MultipartContentHeader *)&local_60,(ContentReceiver *)&local_80);
  std::_Function_base::~_Function_base((_Function_base *)&local_80);
  std::_Function_base::~_Function_base((_Function_base *)&local_60);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  if (bVar1) {
    Request::get_header_value_abi_cxx11_(&local_a0,req,"Content-Type",0);
    lVar2 = std::__cxx11::string::find((char *)&local_a0,0x147fc6);
    bVar1 = true;
    if (lVar2 == 0) {
      if ((req->body)._M_string_length < 0x2001) {
        detail::parse_query_text(&req->body,&req->params);
      }
      else {
        res->status = 0x19d;
        bVar1 = false;
      }
    }
    std::__cxx11::string::~string((string *)&local_a0);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool Server::read_content(Stream &strm, Request &req, Response &res) {
  MultipartFormDataMap::iterator cur;
  if (read_content_core(
          strm, req, res,
          // Regular
          [&](const char *buf, size_t n) {
            if (req.body.size() + n > req.body.max_size()) { return false; }
            req.body.append(buf, n);
            return true;
          },
          // Multipart
          [&](const MultipartFormData &file) {
            cur = req.files.emplace(file.name, file);
            return true;
          },
          [&](const char *buf, size_t n) {
            auto &content = cur->second.content;
            if (content.size() + n > content.max_size()) { return false; }
            content.append(buf, n);
            return true;
          })) {
    const auto &content_type = req.get_header_value("Content-Type");
    if (!content_type.find("application/x-www-form-urlencoded")) {
      if (req.body.size() > CPPHTTPLIB_REQUEST_URI_MAX_LENGTH) {
        res.status = 413; // NOTE: should be 414?
        return false;
      }
      detail::parse_query_text(req.body, req.params);
    }
    return true;
  }
  return false;
}